

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdGetTaprootTweakedPrivkey
              (void *handle,void *tree_handle,char *internal_privkey,char **tweaked_privkey)

{
  bool bVar1;
  undefined8 uVar2;
  reference object;
  reference object_00;
  char *pcVar3;
  undefined8 *in_RCX;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  Privkey taproot_privkey;
  Privkey privkey;
  TapBranch branch;
  CfdCapiTapscriptTree *buffer;
  int result;
  Privkey *in_stack_fffffffffffffcd8;
  TapBranch *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd40;
  string local_280;
  Privkey local_260;
  allocator local_239;
  string local_238;
  string *in_stack_fffffffffffffde8;
  pointer in_stack_fffffffffffffdf0;
  allocator local_1f1;
  string local_1f0;
  Privkey local_1d0;
  allocator local_1a9;
  string local_1a8;
  Privkey local_188;
  TapBranch local_168;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  long local_70;
  allocator local_61;
  string local_60 [52];
  undefined4 local_2c;
  undefined8 *local_28;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  local_2c = 0xffffffff;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"TapscriptTree",&local_61);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_70 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0x44a;
    local_88.funcname = "CfdGetTaprootTweakedPrivkey";
    cfd::core::logger::warn<>(&local_88,"internal_privkey is null or empty.");
    local_aa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,"Failed to parameter. internal_privkey is null or empty.",&local_a9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd00,error_code,in_stack_fffffffffffffcf0);
    local_aa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 == (undefined8 *)0x0) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x450;
    local_c8.funcname = "CfdGetTaprootTweakedPrivkey";
    cfd::core::logger::warn<>(&local_c8,"tweaked_privkey is null.");
    local_ea = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"Failed to parameter. tweaked_privkey is null.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd00,error_code,in_stack_fffffffffffffcf0);
    local_ea = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::TapBranch::TapBranch(&local_168);
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_70 + 0x18));
  if (bVar1) {
    object_00 = std::
                vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                ::at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                      *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
    cfd::core::TapBranch::operator=(&local_168,&object_00->super_TapBranch);
  }
  else {
    object = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                       ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                        in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
    cfd::core::TapBranch::operator=(&local_168,object);
  }
  cfd::core::Privkey::Privkey(&local_188);
  pcVar3 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,pcVar3,&local_1a9);
  bVar1 = cfd::core::Privkey::HasWif(&local_1a8,(NetType *)0x0,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,local_20,&local_1f1);
    cfd::core::Privkey::FromWif(&local_1d0,&local_1f0,kCustomChain,true);
    cfd::core::Privkey::operator=((Privkey *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    cfd::core::Privkey::~Privkey((Privkey *)0x59eae2);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  }
  else {
    paVar4 = &local_239;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_238,local_20,paVar4);
    cfd::core::Privkey::Privkey((Privkey *)&stack0xfffffffffffffde8,&local_238,kMainnet,true);
    cfd::core::Privkey::operator=((Privkey *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    cfd::core::Privkey::~Privkey((Privkey *)0x59ec0b);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
  }
  cfd::core::TapBranch::GetTweakedPrivkey(&local_260,&local_168,&local_188,(bool *)0x0);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_280,&local_260);
  pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffd40);
  *local_28 = pcVar3;
  std::__cxx11::string::~string((string *)&local_280);
  local_4 = 0;
  cfd::core::Privkey::~Privkey((Privkey *)0x59ecf3);
  cfd::core::Privkey::~Privkey((Privkey *)0x59ed00);
  cfd::core::TapBranch::~TapBranch(in_stack_fffffffffffffce0);
  return local_4;
}

Assistant:

int CfdGetTaprootTweakedPrivkey(
    void* handle, void* tree_handle, const char* internal_privkey,
    char** tweaked_privkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    if (IsEmptyString(internal_privkey)) {
      warn(CFD_LOG_SOURCE, "internal_privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. internal_privkey is null or empty.");
    }
    if (tweaked_privkey == nullptr) {
      warn(CFD_LOG_SOURCE, "tweaked_privkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweaked_privkey is null.");
    }
    TapBranch branch;
    if (!buffer->branch_buffer->empty()) {
      branch = buffer->branch_buffer->at(0);
    } else {
      branch = buffer->tree_buffer->at(0);
    }
    Privkey privkey;
    if (Privkey::HasWif(internal_privkey)) {
      privkey = Privkey::FromWif(internal_privkey);
    } else {
      privkey = Privkey(internal_privkey);
    }
    auto taproot_privkey = branch.GetTweakedPrivkey(privkey);
    *tweaked_privkey = CreateString(taproot_privkey.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}